

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::Vertex::insert_above(Vertex *this,Edge *e)

{
  vec2 *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  LinkedList<TRM::Edge> *pLVar6;
  Edge *pEVar7;
  Edge *pEVar8;
  Edge **ppEVar9;
  
  fVar2 = (e->top->point).field_0.x;
  fVar3 = (e->top->point).field_1.y;
  pvVar1 = &e->bottom->point;
  bVar5 = fVar2 != (pvVar1->field_0).x;
  fVar4 = (e->bottom->point).field_1.y;
  if (((bVar5 || fVar3 != fVar4) && (fVar3 <= fVar4)) &&
     ((fVar2 < (pvVar1->field_0).x || !bVar5) || fVar3 != fVar4)) {
    pEVar7 = (this->edge_above).head;
    if (pEVar7 == (Edge *)0x0) {
      pEVar8 = (Edge *)0x0;
LAB_0011c2af:
      ppEVar9 = &(this->edge_above).tail;
      e->above_prev = pEVar8;
      e->above_next = (Edge *)0x0;
      pLVar6 = (LinkedList<TRM::Edge> *)&pEVar8->above_next;
      if (pEVar8 == (Edge *)0x0) {
        pLVar6 = &this->edge_above;
      }
      pLVar6->head = e;
    }
    else {
      if (0.0 <= pEVar7->le_a * (double)fVar2 + pEVar7->le_b * (double)fVar3 + pEVar7->le_c) {
        do {
          pEVar8 = pEVar7;
          pEVar7 = pEVar8->above_next;
          if (pEVar7 == (Edge *)0x0) goto LAB_0011c2af;
        } while (0.0 <= pEVar7->le_a * (double)fVar2 + pEVar7->le_b * (double)fVar3 + pEVar7->le_c);
      }
      else {
        pEVar8 = (Edge *)0x0;
      }
      e->above_prev = pEVar8;
      pLVar6 = (LinkedList<TRM::Edge> *)&pEVar8->above_next;
      if (pEVar8 == (Edge *)0x0) {
        pLVar6 = &this->edge_above;
      }
      e->above_next = pEVar7;
      pLVar6->head = e;
      ppEVar9 = &pEVar7->above_prev;
    }
    *ppEVar9 = e;
  }
  return;
}

Assistant:

void Vertex::insert_above(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not above
  ) {
    return;
  }

  Edge* above_prev = nullptr;
  Edge* above_next = nullptr;

  for (above_next = edge_above.head; above_next != nullptr;
       above_next = above_next->above_next) {
    if (above_next->is_right_of(e->top->point)) {
      break;
    }

    above_prev = above_next;
  }

  LinkedList<Edge>::Insert<&Edge::above_prev, &Edge::above_next>(
      e, above_prev, above_next, &edge_above.head, &edge_above.tail);
}